

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Company *company)

{
  int iVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  
  poVar2 = std::operator<<(os,"budget: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,company->budget);
  poVar2 = std::operator<<(poVar2," boss: ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployee(company->boss);
    if (iVar1 <= lVar3) break;
    poVar2 = std::operator<<(os," employee: ");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    std::operator<<(poVar2,"\t");
    lVar3 = lVar3 + 1;
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const Company &company) {
    os << "budget: " << company.budget << " boss: " << company.boss << endl;
    for (int i = 0; i < company.boss->getNumberOfEmployee(); ++i) {
        os << " employee: " << company.employee[i] << "\t";
    }
    return os;
}